

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_handler.hpp
# Opt level: O1

void __thiscall
asio::detail::
binder2<std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::error_code,_unsigned_long>
::operator()(binder2<std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::error_code,_unsigned_long>
             *this)

{
  unsigned_long local_8;
  
  local_8 = this->arg2_;
  if ((this->handler_).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->handler_)._M_invoker)((_Any_data *)this,&this->arg1_,&local_8);
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void operator()()
  {
    static_cast<Handler&&>(handler_)(
        static_cast<const Arg1&>(arg1_),
        static_cast<const Arg2&>(arg2_));
  }